

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Promise<unsigned_long>_>::setCapacity
          (Vector<kj::Promise<unsigned_long>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Promise<unsigned_long>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Promise<unsigned_long>_> newBuilder;
  size_t newSize_local;
  Vector<kj::Promise<unsigned_long>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::Promise<unsigned_long>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Promise<unsigned_long>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::Promise<unsigned_long>>
            ((ArrayBuilder<kj::Promise<unsigned_long>_> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::Promise<unsigned_long>>>(&this->builder);
  ArrayBuilder<kj::Promise<unsigned_long>>::addAll<kj::ArrayBuilder<kj::Promise<unsigned_long>>>
            ((ArrayBuilder<kj::Promise<unsigned_long>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Promise<unsigned_long>>>
                     ((ArrayBuilder<kj::Promise<unsigned_long>_> *)local_38);
  ArrayBuilder<kj::Promise<unsigned_long>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::Promise<unsigned_long>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Promise<unsigned_long>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }